

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

Vec_Str_t * Fra_SmlSimulateReadFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  int c;
  FILE *pFile;
  Vec_Str_t *vRes;
  char *pFileName_local;
  
  vRes = (Vec_Str_t *)pFileName;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" with simulation patterns.\n",vRes);
    pFileName_local = (char *)0x0;
  }
  else {
    pFile = (FILE *)Vec_StrAlloc(1000);
    do {
      while( true ) {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) goto LAB_00863554;
        if ((iVar1 != 0x30) && (iVar1 != 0x31)) break;
        Vec_StrPush((Vec_Str_t *)pFile,(char)iVar1 + -0x30);
      }
    } while ((((iVar1 == 0x20) || (iVar1 == 0xd)) || (iVar1 == 10)) || (iVar1 == 9));
    printf("File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n",vRes,
           (ulong)(uint)(int)(char)iVar1);
    Vec_StrFreeP((Vec_Str_t **)&pFile);
LAB_00863554:
    fclose(__stream);
    pFileName_local = (char *)pFile;
  }
  return (Vec_Str_t *)pFileName_local;
}

Assistant:

Vec_Str_t * Fra_SmlSimulateReadFile( char * pFileName )
{
    Vec_Str_t * vRes;
    FILE * pFile;
    int c;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" with simulation patterns.\n", pFileName );
        return NULL;
    }
    vRes = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_StrPush( vRes, (char)(c - '0') );
        else if ( c != ' ' && c != '\r' && c != '\n' && c != '\t' )
        {
            printf( "File \"%s\" contains symbol (%c) other than \'0\' or \'1\'.\n", pFileName, (char)c );
            Vec_StrFreeP( &vRes );
            break;
        }
    }
    fclose( pFile );
    return vRes;
}